

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hpf1_reinit(ma_hpf1_config *pConfig,ma_hpf1 *pHPF)

{
  ma_format mVar1;
  ma_result mVar2;
  double dVar3;
  
  mVar2 = MA_INVALID_ARGS;
  if (((pConfig != (ma_hpf1_config *)0x0 && pHPF != (ma_hpf1 *)0x0) &&
      (((mVar1 = pConfig->format, mVar1 == ma_format_f32 ||
        (mVar2 = MA_INVALID_ARGS, mVar1 == ma_format_s16)) &&
       (mVar2 = MA_INVALID_OPERATION, pHPF->format == ma_format_unknown || pHPF->format == mVar1))))
     && ((pHPF->channels == 0 || (pHPF->channels == pConfig->channels)))) {
    pHPF->format = mVar1;
    pHPF->channels = pConfig->channels;
    dVar3 = exp((pConfig->cutoffFrequency * -6.283185307179586) / (double)pConfig->sampleRate);
    if (pConfig->format == ma_format_f32) {
      (pHPF->a).f32 = (float)dVar3;
    }
    else {
      (pHPF->a).s32 = (int)(dVar3 * 16384.0);
    }
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_hpf1_reinit(const ma_hpf1_config* pConfig, ma_hpf1* pHPF)
{
    double a;

    if (pHPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pHPF->format != ma_format_unknown && pHPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pHPF->channels != 0 && pHPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    pHPF->format   = pConfig->format;
    pHPF->channels = pConfig->channels;

    a = ma_expd(-2 * MA_PI_D * pConfig->cutoffFrequency / pConfig->sampleRate);
    if (pConfig->format == ma_format_f32) {
        pHPF->a.f32 = (float)a;
    } else {
        pHPF->a.s32 = ma_biquad_float_to_fp(a);
    }

    return MA_SUCCESS;
}